

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intervals.cpp
# Opt level: O2

void __thiscall
IntervalsTest_TestOverlapRandomSequence_Test::IntervalsTest_TestOverlapRandomSequence_Test
          (IntervalsTest_TestOverlapRandomSequence_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_002ba620;
  return;
}

Assistant:

TEST(IntervalsTest, TestOverlapRandomSequence) {
  std::vector<Interval> intervals;
  intervals.emplace_back(21, 24, 1);
  intervals.emplace_back(0, 5, 1);
  intervals.emplace_back(11, 18, 1);
  intervals.emplace_back(28, 35, 1);
  intervals.emplace_back(5, 11, 1);
  intervals.emplace_back(18, 21, 1);
  intervals.emplace_back(35, 40, 1);
  intervals.emplace_back(24, 28, 1);
  std::vector<int> expected{1, 4, 2, 5, 0, 7, 3, 6};
  ASSERT_EQ(IntervalProcessor::filterOverlaps(intervals), expected);
}